

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_buildFSETable
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,int bmi2)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  U32 u_1;
  undefined4 uVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  U32 tableMask;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  short sVar13;
  size_t u;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  bVar12 = (byte)tableLog;
  if (bmi2 == 0) {
    uVar15 = 1 << (bVar12 & 0x1f);
    uVar4 = 1;
    uVar8 = uVar15 - 1;
    uVar7 = maxSymbolValue + 1;
    uVar10 = uVar8;
    if (uVar7 != 0) {
      uVar19 = 0;
      uVar4 = 1;
      do {
        sVar13 = normalizedCounter[uVar19];
        if (sVar13 == -1) {
          uVar11 = (ulong)uVar10;
          uVar10 = uVar10 - 1;
          dt[uVar11 + 1].baseValue = (U32)uVar19;
          sVar13 = 1;
        }
        else if ((0x10000 << (bVar12 - 1 & 0x1f)) >> 0x10 <= (int)sVar13) {
          uVar4 = 0;
        }
        *(short *)((long)wksp + uVar19 * 2) = sVar13;
        uVar19 = uVar19 + 1;
      } while (uVar7 != uVar19);
    }
    dt->nextState = (short)uVar4;
    dt->nbAdditionalBits = (char)((uint)uVar4 >> 0x10);
    dt->nbBits = (char)((uint)uVar4 >> 0x18);
    dt->baseValue = tableLog;
    auVar3 = _DAT_0135a310;
    auVar2 = _DAT_01352200;
    if (uVar10 == uVar8) {
      lVar6 = (long)wksp + 0x6a;
      iVar18 = (uVar15 >> 3) + (uVar15 >> 1) + 3;
      if (uVar7 != 0) {
        uVar19 = 0;
        lVar9 = 0;
        lVar16 = 0;
        do {
          uVar1 = normalizedCounter[uVar19];
          *(long *)(lVar6 + lVar9) = lVar16;
          if (8 < (long)(short)uVar1) {
            uVar10 = 0x10;
            if (0x10 < uVar1) {
              uVar10 = (int)(short)uVar1;
            }
            uVar11 = (ulong)(uVar10 & 0xffff) - 9;
            auVar22._8_4_ = (int)uVar11;
            auVar22._0_8_ = uVar11;
            auVar22._12_4_ = (int)(uVar11 >> 0x20);
            auVar20._0_8_ = uVar11 >> 3;
            auVar20._8_8_ = auVar22._8_8_ >> 3;
            auVar20 = auVar20 ^ auVar2;
            uVar14 = 0;
            do {
              auVar21._8_4_ = (int)uVar14;
              auVar21._0_8_ = uVar14;
              auVar21._12_4_ = (int)(uVar14 >> 0x20);
              auVar22 = (auVar21 | auVar3) ^ auVar2;
              if ((bool)(~(auVar20._4_4_ < auVar22._4_4_ ||
                          auVar20._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar20._4_4_) & 1)) {
                *(long *)(lVar6 + lVar9 + 8 + uVar14 * 8) = lVar16;
              }
              if (auVar22._12_4_ <= auVar20._12_4_ &&
                  (auVar22._8_4_ <= auVar20._8_4_ || auVar22._12_4_ != auVar20._12_4_)) {
                *(long *)(lVar6 + lVar9 + 0x10 + uVar14 * 8) = lVar16;
              }
              uVar14 = uVar14 + 2;
            } while (((uVar11 >> 3) + 2 & 0xfffffffffffffffe) != uVar14);
          }
          lVar9 = lVar9 + (short)uVar1;
          uVar19 = uVar19 + 1;
          lVar16 = lVar16 + 0x101010101010101;
        } while (uVar19 != uVar7);
      }
      uVar19 = 0;
      uVar10 = 0;
      do {
        lVar9 = 0;
        uVar7 = uVar10;
        do {
          dt[(ulong)(uVar7 & uVar8) + 1].baseValue = (uint)*(byte *)(lVar6 + lVar9);
          lVar9 = lVar9 + 1;
          uVar7 = uVar7 + iVar18;
        } while (lVar9 == 1);
        uVar10 = uVar10 + iVar18 * 2 & uVar8;
        uVar19 = uVar19 + 2;
        lVar6 = lVar6 + 2;
      } while (uVar19 < uVar15);
    }
    else if (uVar7 != 0) {
      uVar19 = (ulong)(uint)(0 << (bVar12 & 0x1f));
      uVar11 = 0;
      do {
        sVar13 = normalizedCounter[uVar19];
        if (0 < sVar13) {
          iVar18 = 0;
          do {
            dt[uVar11 + 1].baseValue = (U32)uVar19;
            do {
              uVar17 = (int)uVar11 + (uVar15 >> 3) + (uVar15 >> 1) + 3 & uVar8;
              uVar11 = (ulong)uVar17;
            } while (uVar10 < uVar17);
            iVar18 = iVar18 + 1;
          } while (iVar18 != sVar13);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar7);
    }
    uVar19 = 0;
    do {
      uVar11 = (ulong)dt[uVar19 + 1].baseValue;
      uVar1 = *(ushort *)((long)wksp + uVar11 * 2);
      *(ushort *)((long)wksp + uVar11 * 2) = uVar1 + 1;
      iVar18 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      bVar5 = bVar12 - (char)iVar18;
      dt[uVar19 + 1].nbBits = bVar5;
      dt[uVar19 + 1].nextState = (uVar1 << (bVar5 & 0x1f)) - (short)uVar15;
      dt[uVar19 + 1].nbAdditionalBits = nbAdditionalBits[uVar11];
      dt[uVar19 + 1].baseValue = baseValue[uVar11];
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
    return;
  }
  ZSTD_buildFSETable_body_bmi2
            (dt,normalizedCounter,maxSymbolValue,baseValue,nbAdditionalBits,tableLog,wksp,wkspSize);
  return;
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}